

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase298::run(TestCase298 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  char cVar2;
  int iVar3;
  byte bVar4;
  size_t __n;
  CapTableReader *pCVar5;
  bool bVar6;
  ArrayPtr<const_char> AVar7;
  ArrayPtr<const_char> AVar8;
  Schema schema;
  DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> _kjCondition;
  SchemaLoader loader;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_270;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_268;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 local_260;
  ArrayPtr<const_char> local_258;
  char *local_248;
  ulong local_240;
  char local_238;
  Reader local_230;
  Reader local_200;
  ArrayPtr<const_char> local_1d0;
  SchemaLoader local_1c0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Schema local_d8;
  ArrayPtr<const_char> local_d0;
  PointerReader local_c0;
  LazyLoadCallback local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  byte local_68;
  Reader local_60;
  
  local_1d0.size_ = (size_t)local_1d0.ptr;
  local_260 = local_268;
  local_268 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x6ea968;
  Schema::getProto(&local_60,&local_268.value);
  local_78 = local_60._reader.dataSize;
  SStack_74 = local_60._reader.pointerCount;
  uStack_72 = local_60._reader._38_2_;
  iStack_70 = local_60._reader.nestingLimit;
  uStack_6c = local_60._reader._44_4_;
  local_88 = local_60._reader.data;
  pWStack_80 = local_60._reader.pointers;
  local_98 = local_60._reader.segment;
  pCStack_90 = local_60._reader.capTable;
  local_a0._vptr_LazyLoadCallback = (_func_int **)&PTR_load_006e3bf8;
  local_68 = 0;
  SchemaLoader::SchemaLoader(&local_1c0,&local_a0);
  local_e8 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e0 = 0x7fffffff;
  pCVar5 = (CapTableReader *)0x6ff7f8;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SchemaLoader::tryGet((SchemaLoader *)&local_230,(uint64_t)&local_1c0,brand,(Schema)0x4d2);
  cVar2 = (char)local_230._reader.segment;
  if ((char)local_230._reader.segment == '\x01') {
    local_230._reader.segment =
         (SegmentReader *)((ulong)local_230._reader.segment & 0xffffffffffffff00);
    pCVar5 = local_230._reader.capTable;
  }
  local_268._0_1_ = cVar2;
  if (cVar2 != '\0') {
    local_260 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)pCVar5;
  }
  local_258.size_ = (size_t)" == ";
  local_258.ptr = &kj::none;
  local_248 = &DAT_00000005;
  local_240 = CONCAT71(local_240._1_7_,cVar2) ^ 1;
  if ((cVar2 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<capnp::Schema>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x12e,ERROR,
               "\"failed: expected \" \"loader.tryGet(1234) == kj::none\", _kjCondition",
               (char (*) [49])"failed: expected loader.tryGet(1234) == kj::none",
               (DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)&local_268.value);
  }
  bVar4 = local_68 ^ 1;
  local_268._0_1_ = bVar4;
  if ((local_68 == 1) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x130,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
               (char (*) [40])"failed: expected !(callback.isLoaded())",
               (DebugExpression<bool> *)&local_268.value);
  }
  local_118 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  uStack_120 = 0;
  uStack_110 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_00._reader._40_8_ = 0x7fffffff;
  brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_00._reader.data = (void *)auVar1._16_8_;
  brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_00._reader.dataSize = auVar1._32_4_;
  brand_00._reader.pointerCount = auVar1._36_2_;
  brand_00._reader._38_2_ = auVar1._38_2_;
  local_270.value = SchemaLoader::get(&local_1c0,0xa0a8f314b80b63fd,brand_00,(Schema)0x6ff7f8);
  local_268._0_1_ = local_68;
  if ((local_68 == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x132,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
               (char (*) [37])"failed: expected callback.isLoaded()",
               (DebugExpression<bool> *)&local_268.value);
  }
  Schema::getProto(&local_230,&local_270.value);
  local_200._reader.capTable = local_230._reader.capTable;
  local_200._reader.data = local_230._reader.pointers;
  local_200._reader.segment = local_230._reader.segment;
  local_200._reader.pointers._0_4_ = local_230._reader.nestingLimit;
  if (local_230._reader.pointerCount == 0) {
    local_200._reader.capTable = (CapTableReader *)0x0;
    local_200._reader.data = (WirePointer *)0x0;
    local_200._reader.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
    local_200._reader.pointers._0_4_ = 0x7fffffff;
  }
  AVar7 = (ArrayPtr<const_char>)
          PointerReader::getBlob<capnp::Text>((PointerReader *)&local_200,(void *)0x0,0);
  __n = AVar7.size_;
  local_1d0.ptr = schemas::s_a0a8f314b80b63fd + 0x48;
  Schema::getProto(&local_200,(Schema *)&local_1d0);
  if (local_200._reader.pointerCount == 0) {
    local_c0.nestingLimit = 0x7fffffff;
    local_c0.capTable = (CapTableReader *)0x0;
    local_c0.pointer = (WirePointer *)0x0;
    local_c0.segment = (SegmentReader *)0x0;
  }
  else {
    local_c0.pointer =
         (WirePointer *)CONCAT44(local_200._reader.pointers._4_4_,(int)local_200._reader.pointers);
    local_c0.capTable = local_200._reader.capTable;
    local_c0.segment = local_200._reader.segment;
    local_c0.nestingLimit = local_200._reader.nestingLimit;
  }
  AVar8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_c0,(void *)0x0,0);
  if (__n == AVar8.size_) {
    if (__n == 0) {
      local_238 = true;
    }
    else {
      iVar3 = bcmp(AVar7.ptr,AVar8.ptr,__n);
      local_238 = iVar3 == 0;
    }
  }
  else {
    local_238 = false;
  }
  local_248 = " == ";
  local_240 = 5;
  _local_268 = AVar7;
  local_258 = AVar8;
  if (((bool)local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_230,&local_270.value);
    local_200._reader.segment = local_230._reader.segment;
    if (local_230._reader.pointerCount == 0) {
      local_230._reader.nestingLimit = 0x7fffffff;
      local_230._reader.capTable = (CapTableReader *)0x0;
      local_230._reader.pointers = (WirePointer *)0x0;
      local_200._reader.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
    }
    local_200._reader.capTable = local_230._reader.capTable;
    local_200._reader.data = local_230._reader.pointers;
    local_200._reader.pointers._0_4_ = local_230._reader.nestingLimit;
    local_1d0 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_200,(void *)0x0,0);
    local_d8.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
    Schema::getProto(&local_200,&local_d8);
    if (local_200._reader.pointerCount == 0) {
      local_200._reader.nestingLimit = 0x7fffffff;
      local_c0.capTable = (CapTableReader *)0x0;
      local_c0.pointer = (WirePointer *)0x0;
      local_c0.segment = (SegmentReader *)0x0;
    }
    else {
      local_c0.pointer =
           (WirePointer *)CONCAT44(local_200._reader.pointers._4_4_,(int)local_200._reader.pointers)
      ;
      local_c0.capTable = local_200._reader.capTable;
      local_c0.segment = local_200._reader.segment;
    }
    local_c0.nestingLimit = local_200._reader.nestingLimit;
    local_d0 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_c0,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[116],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x135,ERROR,
               "\"failed: expected \" \"(schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, schema.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
               ,(char (*) [116])
                "failed: expected (schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&local_268.value,
               (Reader *)&local_1d0,(Reader *)&local_d0);
  }
  local_260.value = Schema::getDependency(&local_270.value,0xa0a8f314b80b63fd,0);
  bVar6 = local_270 == local_260;
  local_258.ptr = " == ";
  local_258.size_ = (size_t)&DAT_00000005;
  local_268 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)&local_270;
  local_248._0_1_ = bVar6;
  if ((!bVar6) && (kj::_::Debug::minSeverity < 3)) {
    local_230._reader.segment =
         (SegmentReader *)Schema::getDependency(&local_270.value,0xa0a8f314b80b63fd,0);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x137,ERROR,
               "\"failed: expected \" \"(schema) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, schema, schema.getDependency(typeId<TestAllTypes>())"
               ,(char (*) [76])
                "failed: expected (schema) == (schema.getDependency(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&local_268.value,&local_270.value,
               (Schema *)&local_230);
  }
  local_148 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_140 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand_01._reader._40_8_ = 0x7fffffff;
  brand_01._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand_01._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand_01._reader.data = (void *)auVar1._16_8_;
  brand_01._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand_01._reader.dataSize = auVar1._32_4_;
  brand_01._reader.pointerCount = auVar1._36_2_;
  brand_01._reader._38_2_ = auVar1._38_2_;
  local_260.value = SchemaLoader::get(&local_1c0,0xa0a8f314b80b63fd,brand_01,(Schema)0x6ff7f8);
  local_268 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)&local_270;
  local_258.size_ = 5;
  local_258.ptr = " == ";
  local_248 = (char *)CONCAT71(local_248._1_7_,local_270 == local_260);
  if ((local_270 != local_260) && (kj::_::Debug::minSeverity < 3)) {
    local_178 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_188 = 0;
    uStack_180 = 0;
    uStack_170 = 0x7fffffff;
    auVar1 = ZEXT1640(ZEXT816(0));
    brand_02._reader._40_8_ = 0x7fffffff;
    brand_02._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand_02._reader.data = (void *)auVar1._16_8_;
    brand_02._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand_02._reader.dataSize = auVar1._32_4_;
    brand_02._reader.pointerCount = auVar1._36_2_;
    brand_02._reader._38_2_ = auVar1._38_2_;
    local_230._reader.segment =
         (SegmentReader *)SchemaLoader::get(&local_1c0,0xa0a8f314b80b63fd,brand_02,(Schema)0x6ff7f8)
    ;
    kj::_::Debug::
    log<char_const(&)[66],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x138,ERROR,
               "\"failed: expected \" \"(schema) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, schema, loader.get(typeId<TestAllTypes>())"
               ,(char (*) [66])"failed: expected (schema) == (loader.get(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&local_268.value,&local_270.value,
               (Schema *)&local_230);
  }
  SchemaLoader::~SchemaLoader(&local_1c0);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoad) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  EXPECT_TRUE(loader.tryGet(1234) == kj::none);

  EXPECT_FALSE(callback.isLoaded());
  Schema schema = loader.get(typeId<TestAllTypes>());
  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(schema.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(schema, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(schema, loader.get(typeId<TestAllTypes>()));
}